

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O1

void duckdb::ExtensionHelper::AutoLoadExtension(DatabaseInstance *db,string *extension_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  DBConfig *pDVar4;
  type pFVar5;
  Logger *this;
  DBConfigOptions *options_00;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs;
  string repository_url;
  ExtensionInstallOptions options;
  ExtensionRepository autoinstall_repo;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_100;
  ExtensionInstallInfo *local_f8;
  string local_f0;
  ExtensionInstallOptions local_d0;
  ExtensionRepository local_a0 [2];
  
  bVar2 = DatabaseInstance::ExtensionIsLoaded(db,extension_name);
  if (!bVar2) {
    pDVar4 = DBConfig::GetConfig(db);
    FileSystem::CreateLocal();
    if ((pDVar4->options).autoinstall_known_extensions == true) {
      GetAutoInstallExtensionsRepository_abi_cxx11_(&local_f0,(duckdb *)&pDVar4->options,options_00)
      ;
      ExtensionRepository::GetRepositoryByUrl(local_a0,&local_f0);
      paVar1 = &local_d0.version.field_2;
      local_d0.version._M_string_length = 0;
      local_d0.version.field_2._M_local_buf[0] = '\0';
      local_d0.force_install = false;
      local_d0.use_etags = false;
      local_d0.throw_on_origin_mismatch = false;
      local_d0.repository.ptr = local_a0;
      local_d0.version._M_dataplus._M_p = (pointer)paVar1;
      pFVar5 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
               operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                          *)&local_100);
      InstallExtension((ExtensionHelper *)&local_f8,db,pFVar5,extension_name,&local_d0);
      if (local_f8 != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&local_f8,local_f8);
      }
      local_f8 = (ExtensionInstallInfo *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.version._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0.version._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0[0].path._M_dataplus._M_p != &local_a0[0].path.field_2) {
        operator_delete(local_a0[0].path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0[0].name._M_dataplus._M_p != &local_a0[0].name.field_2) {
        operator_delete(local_a0[0].name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    pFVar5 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&local_100);
    LoadExternalExtension(db,pFVar5,extension_name);
    this = Logger::Get(db);
    iVar3 = (*this->_vptr_Logger[2])(this,"duckdb.Extensions.ExtensionAutoloaded",0x1e);
    if ((char)iVar3 != '\0') {
      Logger::WriteLog(this,"duckdb.Extensions.ExtensionAutoloaded",LOG_INFO,extension_name);
    }
    if (local_100._M_head_impl != (FileSystem *)0x0) {
      (*(local_100._M_head_impl)->_vptr_FileSystem[1])();
    }
  }
  return;
}

Assistant:

void ExtensionHelper::AutoLoadExtension(DatabaseInstance &db, const string &extension_name) {
	if (db.ExtensionIsLoaded(extension_name)) {
		// Avoid downloading again
		return;
	}
	auto &dbconfig = DBConfig::GetConfig(db);
	try {
		auto fs = FileSystem::CreateLocal();
#ifndef DUCKDB_WASM
		if (dbconfig.options.autoinstall_known_extensions) {
			auto repository_url = GetAutoInstallExtensionsRepository(dbconfig.options);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(repository_url);
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(db, *fs, extension_name, options);
		}
#endif
		ExtensionHelper::LoadExternalExtension(db, *fs, extension_name);
		DUCKDB_LOG_INFO(db, "duckdb.Extensions.ExtensionAutoloaded", extension_name);

	} catch (std::exception &e) {
		ErrorData error(e);
		throw AutoloadException(extension_name, error.RawMessage());
	}
}